

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyevent.c
# Opt level: O2

void copy_cursor(int newx,int newy)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  sbyte sVar7;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  uint *puVar11;
  int iVar12;
  uint uVar13;
  uint *puVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint local_64;
  uint local_50;
  uint *local_40;
  
  uVar2 = displaywidth;
  iVar1 = LastCursorClippingX;
  if (newx < 0) {
    uVar5 = -(ulong)(7U - newx >> 3);
  }
  else {
    uVar5 = (ulong)((uint)newx >> 3);
  }
  uVar5 = (long)DisplayRegion68k + uVar5 + (long)(((int)displaywidth / 0x10) * newy) * 2;
  local_40 = (uint *)(uVar5 & 0xfffffffffffffffc);
  uVar13 = (newx & 7U) + ((uint)uVar5 & 3) * 8;
  local_50 = (LastCursorClippingX + uVar13) - 1 & 0x1f;
  uVar15 = 0;
  local_64 = -1 << (~(byte)local_50 & 0x1f);
  uVar9 = -(uint)(uVar13 == 0) | -1 << (-(char)uVar13 & 0x1fU) ^ 0xffffffffU;
  uVar17 = (int)EmCursorBitMap68K * 8;
  uVar8 = uVar17 - uVar13 & 0x1f;
  uVar18 = local_64 & uVar9;
  uVar16 = -(uint)(uVar8 == 0) | ~(-1 << (sbyte)uVar8);
  uVar3 = uVar17 & 0x18;
  iVar4 = uVar13 + (int)EmCursorBitMap68K * -8;
  puVar11 = (uint *)((ulong)EmCursorBitMap68K & 0xfffffffffffffffc);
  iVar12 = LastCursorClippingY;
  do {
    if (iVar12 < 1) {
      return;
    }
    bVar6 = (byte)iVar4 & 0x1f;
    sVar7 = (sbyte)uVar8;
    if (uVar13 < uVar3) {
      uVar8 = *puVar11 << sVar7;
      if ((int)(iVar1 + uVar3) < 0x21) {
        puVar14 = puVar11 + 1;
      }
      else {
        puVar14 = puVar11 + 2;
        uVar8 = uVar8 | puVar11[1] >> bVar6 & uVar16;
        uVar15 = puVar11[1] << sVar7 & ~uVar16;
      }
    }
    else {
      puVar14 = puVar11 + 1;
      uVar8 = *puVar11 >> bVar6 & uVar16;
      uVar15 = *puVar11 << sVar7 & ~uVar16;
    }
    puVar10 = local_40;
    if ((int)(iVar1 + uVar13) < 0x21) {
LAB_0012354d:
      uVar9 = *puVar10;
      *puVar10 = ((uVar8 | uVar9) ^ uVar9) & uVar18 ^ uVar9;
    }
    else {
      iVar4 = ((int)(uVar13 + iVar1) >> 5) + -1;
      uVar18 = *local_40;
      *local_40 = ((uVar8 | uVar18) ^ uVar18) & uVar9 ^ uVar18;
      puVar10 = local_40 + 1;
      if (uVar3 == uVar13) {
        for (; 0 < iVar4; iVar4 = iVar4 + -1) {
          uVar18 = *puVar14;
          puVar14 = puVar14 + 1;
          *puVar10 = *puVar10 | uVar18;
          puVar10 = puVar10 + 1;
        }
      }
      else {
        for (; 0 < iVar4; iVar4 = iVar4 + -1) {
          uVar18 = *puVar14;
          puVar14 = puVar14 + 1;
          *puVar10 = uVar18 >> bVar6 | *puVar10 | uVar15;
          puVar10 = puVar10 + 1;
          uVar15 = uVar18 << sVar7;
        }
      }
      if (local_50 != 0x1f) {
        uVar8 = uVar15;
        uVar18 = local_64;
        if (((iVar1 + uVar17) - 1 & 0x1f) <= local_50) {
          uVar8 = *puVar14 >> bVar6 & uVar16 | uVar15;
        }
        goto LAB_0012354d;
      }
    }
    iVar12 = iVar12 + -1;
    uVar8 = uVar13 + uVar2;
    local_40 = local_40 + ((int)uVar8 >> 5);
    uVar13 = uVar8 & 0x1f;
    local_50 = (uVar13 + iVar1) - 1 & 0x1f;
    local_64 = -1 << (~(byte)local_50 & 0x1f);
    uVar9 = -(uint)(uVar13 == 0) | ~(-1 << (-(char)uVar13 & 0x1fU));
    uVar18 = local_64 & uVar9;
    uVar17 = uVar3 + 0x10;
    puVar11 = puVar11 + (uVar17 >> 5);
    uVar3 = uVar17 & 0x1f;
    iVar4 = uVar13 - uVar17;
    uVar8 = uVar17 - uVar8 & 0x1f;
    uVar16 = -(uint)(uVar8 == 0) | ~(-1 << (sbyte)uVar8);
  } while( true );
}

Assistant:

void copy_cursor(int newx, int newy)
{
  DLword *srcbase, *dstbase;
  static int sx, dx, w, h, srcbpl, dstbpl, backwardflg = 0;
  static int src_comp = 0, op = 0, gray = 0, num_gray = 0, curr_gray_line = 0;
  extern DLword *EmCursorBitMap68K;
  /* copy cursor image */
  srcbase = EmCursorBitMap68K;
  dstbase = DisplayRegion68k + (newy * DLWORD_PERLINE);
  sx = 0;
  dx = newx;
  w = LastCursorClippingX;
  h = LastCursorClippingY;

  srcbpl = HARD_CURSORWIDTH;
  dstbpl = displaywidth;
  op = 2; /* OR-in */
  new_bitblt_code;
#ifdef DISPLAYBUFFER
  flush_display_region(dx, newy, w, h);
#endif
}